

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_6,_8>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  float *pfVar7;
  int col;
  bool bVar8;
  undefined4 uVar9;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Type in0;
  Type in1;
  Vec4 *local_90;
  undefined8 local_88;
  float local_80 [6];
  Matrix<float,_3,_2> local_68;
  Matrix<float,_2,_3> local_48;
  Matrix<float,_3,_3> local_2c;
  
  pfVar2 = (float *)&local_68;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar9 = 0x3f800000;
        if (lVar3 != lVar6) {
          uVar9 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar6) = uVar9;
        lVar6 = lVar6 + 0xc;
      } while (lVar6 == 0xc);
      lVar5 = lVar5 + 1;
      pfVar2 = pfVar2 + 1;
      lVar3 = lVar3 + 0xc;
    } while (lVar5 != 3);
    local_68.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_68.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    local_68.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
    local_68.m_data.m_data[1].m_data[0] = (float)uVar1;
    local_68.m_data.m_data[1].m_data[1] = (float)((ulong)uVar1 >> 0x20);
  }
  else {
    local_68.m_data.m_data[0].m_data[0] = 0.0;
    local_68.m_data.m_data[0].m_data[1] = 0.0;
    local_68.m_data.m_data[0].m_data[2] = 0.0;
    local_68.m_data.m_data[1].m_data[0] = 0.0;
    local_68.m_data.m_data[1].m_data[1] = 0.0;
    local_68.m_data.m_data[1].m_data[2] = 0.0;
    puVar4 = &sr::(anonymous_namespace)::s_constInMat2x3;
    lVar3 = 0;
    do {
      lVar5 = 0;
      pfVar7 = pfVar2;
      do {
        *pfVar7 = (float)puVar4[lVar5];
        lVar5 = lVar5 + 1;
        pfVar7 = pfVar7 + 3;
      } while (lVar5 == 1);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 2;
    } while (lVar3 != 3);
  }
  pfVar2 = (float *)&local_48;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        uVar9 = 0x3f800000;
        if (lVar3 != lVar5) {
          uVar9 = 0;
        }
        pfVar2[lVar5 * 2] = (float)uVar9;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      pfVar2 = pfVar2 + 1;
      bVar8 = lVar3 == 0;
      lVar3 = lVar3 + 1;
    } while (bVar8);
    local_48.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    local_48.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    local_48.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
  }
  else {
    local_48.m_data.m_data[0].m_data[0] = 0.0;
    local_48.m_data.m_data[0].m_data[1] = 0.0;
    local_48.m_data.m_data[1].m_data[0] = 0.0;
    local_48.m_data.m_data[1].m_data[1] = 0.0;
    local_48.m_data.m_data[2].m_data[0] = 0.0;
    local_48.m_data.m_data[2].m_data[1] = 0.0;
    puVar4 = &DAT_00b1d448;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar2[lVar5 * 2] = (float)puVar4[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 3;
      bVar8 = lVar3 == 0;
      lVar3 = lVar3 + 1;
    } while (bVar8);
  }
  tcu::operator*(&local_2c,&local_68,&local_48);
  local_88 = (ulong)local_88._4_4_ << 0x20;
  local_90 = (Vec4 *)0x0;
  lVar3 = 0;
  do {
    *(float *)((long)&local_90 + lVar3 * 4) =
         local_2c.m_data.m_data[0].m_data[lVar3] + local_2c.m_data.m_data[1].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_80[4] = 0.0;
  local_80[2] = 0.0;
  local_80[3] = 0.0;
  lVar3 = 0;
  do {
    local_80[lVar3 + 2] =
         *(float *)((long)&local_90 + lVar3 * 4) + local_2c.m_data.m_data[2].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_90 = &evalCtx->color;
  local_88 = 0x100000000;
  local_80[0] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_90 + lVar3 * 4)] = local_80[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}